

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQInteger __thiscall SQSharedState::CollectGarbage(SQSharedState *this,SQVM *vm)

{
  long lVar1;
  long in_RDI;
  SQCollectable_conflict *nx;
  SQCollectable_conflict *t;
  SQCollectable_conflict *tchain;
  SQInteger n;
  SQCollectable_conflict **in_stack_ffffffffffffffd0;
  long *plVar2;
  SQVM *in_stack_ffffffffffffffd8;
  long *plVar3;
  SQCollectable *this_00;
  SQCollectable *pSVar4;
  SQInteger local_18;
  
  local_18 = 0;
  this_00 = (SQCollectable *)0x0;
  RunMark((SQSharedState *)0x0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  plVar3 = *(long **)(in_RDI + 0x88);
  pSVar4 = this_00;
  if (plVar3 != (long *)0x0) {
    plVar3[1] = plVar3[1] + 1;
    while (pSVar4 = this_00, plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x28))();
      plVar2 = (long *)plVar3[3];
      if (plVar2 != (long *)0x0) {
        plVar2[1] = plVar2[1] + 1;
      }
      lVar1 = plVar3[1];
      plVar3[1] = lVar1 + -1;
      if (lVar1 + -1 == 0) {
        (**(code **)(*plVar3 + 0x10))();
      }
      local_18 = local_18 + 1;
      plVar3 = plVar2;
    }
  }
  for (; this_00 != (SQCollectable *)0x0; this_00 = this_00->_next) {
    SQCollectable::UnMark(this_00);
  }
  *(SQCollectable **)(in_RDI + 0x88) = pSVar4;
  return local_18;
}

Assistant:

SQInteger SQSharedState::CollectGarbage(SQVM *vm)
{
    SQInteger n = 0;
    SQCollectable *tchain = NULL;

    RunMark(vm,&tchain);

    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
            n++;
        }
    }

    t = tchain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }
    _gc_chain = tchain;

    return n;
}